

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O1

int32 read_dict(char *dictfile,char *fillerdict,dicthashelement_t ***dicthash)

{
  long lVar1;
  dicthashelement_t **hashtable;
  FILE *__stream;
  lineiter_t *li;
  char *__s;
  char *pcVar2;
  dicthashelement_t *pdVar3;
  char *__s_00;
  size_t sVar4;
  char **ppcVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  size_t d2;
  int iVar11;
  char *dictfn [2];
  char *local_48 [3];
  
  if (fillerdict == (char *)0x0) {
    lVar1 = 1;
  }
  else {
    lVar1 = 2;
    local_48[1] = fillerdict;
  }
  local_48[0] = dictfile;
  hashtable = (dicthashelement_t **)calloc(0x2717,0x20);
  if (hashtable == (dicthashelement_t **)0x0) {
    pcVar7 = "Unable to allocate space for dictionary\n";
    lVar1 = 0x114;
LAB_00103e34:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,lVar1,pcVar7);
  }
  else {
    lVar6 = 0;
    while( true ) {
      pcVar7 = local_48[lVar6];
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x118,"Reading dict %s\n",pcVar7);
      __stream = fopen(pcVar7,"r");
      if (__stream == (FILE *)0x0) break;
      li = lineiter_start_clean((FILE *)__stream);
      if (li == (lineiter_t *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          if (*li->buf != '\0') {
            __s = strdup(li->buf);
            pcVar2 = strtok(__s," \t\n");
            if (pcVar2 == (char *)0x0) {
              pcVar7 = "Empty line in dictionary!\n";
              lVar1 = 0x127;
              goto LAB_00103e34;
            }
            pdVar3 = dictinstall(pcVar2,hashtable);
            if (pdVar3 == (dicthashelement_t *)0x0) {
              pcVar7 = "Unable to install dict word %s\n";
              lVar1 = 0x12a;
            }
            else if (pdVar3->nphns == 0) {
              uVar8 = 0;
              __s_00 = strtok((char *)0x0," \t\n");
              if (__s_00 == (char *)0x0) {
                d2 = 1;
              }
              else {
                uVar8 = 0;
                iVar11 = 0;
                do {
                  sVar4 = strlen(__s_00);
                  if ((ulong)(long)iVar11 < sVar4) {
                    iVar11 = (int)sVar4;
                  }
                  uVar8 = uVar8 + 1;
                  __s_00 = strtok((char *)0x0," \t\n");
                } while (__s_00 != (char *)0x0);
                d2 = (size_t)(iVar11 + 1);
              }
              if (uVar8 != 0) {
                pdVar3->nphns = uVar8;
                ppcVar5 = (char **)__ckd_calloc_2d__((ulong)uVar8,d2,1,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                                  ,0x137);
                pdVar3->phones = ppcVar5;
                strtok(li->buf," \t\n");
                pcVar2 = strtok((char *)0x0," \t\n");
                if (pcVar2 != (char *)0x0) {
                  lVar10 = 0;
                  do {
                    strcpy(*(char **)((long)pdVar3->phones + lVar10),pcVar2);
                    pcVar2 = strtok((char *)0x0," \t\n");
                    lVar10 = lVar10 + 8;
                  } while (pcVar2 != (char *)0x0);
                }
                uVar9 = uVar9 + 1;
                free(__s);
                goto LAB_00103d56;
              }
              pcVar7 = "Dictionary word %s has no pronunciation\n";
              lVar1 = 0x135;
            }
            else {
              pcVar7 = "Duplicate entry for %s in dictionary\n";
              lVar1 = 0x12d;
            }
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                    ,lVar1,pcVar7,pcVar2);
            goto LAB_00103e40;
          }
          uVar8 = lineiter_lineno(li);
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x121,"Empty line %d in the dictionary file %s\n",(ulong)uVar8,pcVar7);
LAB_00103d56:
          li = lineiter_next(li);
        } while (li != (lineiter_t *)0x0);
      }
      fclose(__stream);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x142,"%d words in dict %s\n",(ulong)uVar9,pcVar7);
      lVar6 = lVar6 + 1;
      if (lVar6 == lVar1) {
        *dicthash = hashtable;
        lineiter_free((lineiter_t *)0x0);
        return uVar9;
      }
    }
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                   ,0x11a,"Unable to open dictionary %s",dictfile);
  }
LAB_00103e40:
  exit(1);
}

Assistant:

int32  read_dict(const char *dictfile, const char *fillerdict, 
		 dicthashelement_t ***dicthash)
{
    char *dictsent;
    const char *dictfn[2];
    lineiter_t *liter = NULL;
    char  *dictword, *word, *phone, *tphn;
    dicthashelement_t   **lhash, *sptr;
    int32  maxphnlen, vocabsiz=0, nphns, numdicts, idict;
    FILE   *dict;

    numdicts = 1;  dictfn[0] = dictfile;
    if (fillerdict != NULL){
        dictfn[1] = fillerdict; 
        numdicts = 2;
    }

    lhash = (dicthashelement_t**)calloc(DICTHASHSIZE,sizeof(dicthashelement_t));
    if (lhash == NULL) E_FATAL("Unable to allocate space for dictionary\n");

    /* Create hash table with dictionary words as entries */
    for (idict = 0; idict < numdicts; idict++){
	E_INFO("Reading dict %s\n",dictfn[idict]);
        if ((dict = fopen(dictfn[idict],"r")) == NULL)
            E_FATAL_SYSTEM("Unable to open dictionary %s", dictfile);

        vocabsiz = 0;
        for (liter = lineiter_start_clean(dict); liter; liter = lineiter_next(liter)) {

	    if (liter->buf[0] == 0) {
		E_WARN("Empty line %d in the dictionary file %s\n", 
			lineiter_lineno(liter), dictfn[idict]);
		continue;
	    }

	    dictsent = strdup(liter->buf);
            if ((dictword = strtok(dictsent, " \t\n")) == NULL)
                E_FATAL("Empty line in dictionary!\n");

            if ((sptr = dictinstall(dictword,lhash)) == NULL)
                E_FATAL("Unable to install dict word %s\n",dictword);

            if (sptr->nphns != 0)
                E_FATAL("Duplicate entry for %s in dictionary\n",dictword);

            /* Count number of phones in pronunciation */
	    maxphnlen = 0;
            for(nphns=0; (tphn=strtok(NULL," \t\n")) != NULL; nphns++){
	        if (strlen(tphn) > maxphnlen) maxphnlen = strlen(tphn);
            }
	    if (nphns == 0)
	        E_FATAL("Dictionary word %s has no pronunciation\n",dictword);
            sptr->nphns = nphns; maxphnlen++;
            sptr->phones = (char**)ckd_calloc_2d(nphns,maxphnlen,sizeof(char));

            word = strtok(liter->buf," \t\n");
            for(nphns=0;(phone = strtok(NULL," \t\n")) != NULL;nphns++)
	        strcpy(sptr->phones[nphns],phone);
	
            ++vocabsiz;
            
            free(dictsent);
        }
        fclose(dict);
        E_INFO("%d words in dict %s\n", vocabsiz, dictfn[idict]);
    }

    *dicthash = lhash;

    lineiter_free(liter);
    return(vocabsiz);
}